

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rgbaInterfaceExamples.cpp
# Opt level: O3

void writeRgba1(char *fileName,Rgba *pixels,int width,int height)

{
  undefined8 uVar1;
  RgbaOutputFile file;
  undefined8 local_38;
  
  local_38 = 0;
  uVar1 = Imf_3_2::globalThreadCount();
  Imf_3_2::RgbaOutputFile::RgbaOutputFile
            ((RgbaOutputFile *)0x3f800000,0x3f800000,(Rgba *)&file,fileName,width,height,0xf,
             &local_38,0,4,uVar1);
  Imf_3_2::RgbaOutputFile::setFrameBuffer((Rgba *)&file,(ulong)pixels,1);
  Imf_3_2::RgbaOutputFile::writePixels((int)&file);
  Imf_3_2::RgbaOutputFile::~RgbaOutputFile(&file);
  return;
}

Assistant:

void
writeRgba1 (const char fileName[], const Rgba* pixels, int width, int height)
{
    //
    // Write an RGBA image using class RgbaOutputFile.
    //
    //	- open the file
    //	- describe the memory layout of the pixels
    //	- store the pixels in the file
    //

    RgbaOutputFile file (fileName, width, height, WRITE_RGBA);
    file.setFrameBuffer (pixels, 1, width);
    file.writePixels (height);
}